

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  MaybeUint MVar1;
  ulong in_RAX;
  ulong extraout_RAX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar3;
  Iterator iter;
  undefined1 local_98 [16];
  Iterator local_88;
  StringPtr *local_70;
  long local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  local_60.maybeFunc.ptr.field_1.value.table =
       (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)local_98;
  if (skip == 1) {
    *this = (Impl<1UL,_false>)0x0;
    aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
  }
  else {
    local_70 = (table->rows).builder.ptr;
    local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 4;
    local_98._0_8_ = (row->content).size_ - 1;
    local_60.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_70;
    local_60.maybeFunc.ptr._0_8_ = &PTR_search_002250d0;
    local_98._8_8_ = pos;
    local_60.maybeFunc.ptr.field_1.value.success = (bool *)(table + 1);
    _::BTreeImpl::insert
              ((Iterator *)((long)local_98 + 0x10),(BTreeImpl *)&table[1].rows.builder.pos,
               (SearchKey *)&local_60);
    in_RAX = (ulong)local_88.row;
    if (in_RAX == 0xe) {
      in_RAX = 0xe;
    }
    else {
      MVar1.i = (local_88.leaf)->rows[in_RAX].i;
      if ((MVar1.i != 0) &&
         (aVar2._0_4_ = MVar1.i - 1, aVar2.value._4_4_ = 0,
         local_70[aVar2.value].content.size_ - 1 == local_98._0_8_)) {
        *this = (Impl<1UL,_false>)0x1;
        ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 8))->value =
             (unsigned_long)aVar2;
        goto LAB_00169027;
      }
    }
    memmove((local_88.leaf)->rows + in_RAX + 1,(local_88.leaf)->rows + in_RAX,
            (ulong)(local_88.row + 1) * -4 + 0x38);
    (local_88.leaf)->rows[in_RAX].i = (int)pos + 1;
    local_60.maybeFunc.ptr.isSet = true;
    local_60.maybeFunc.ptr.field_1.value.success = (bool *)((long)local_98 + 0x10);
    local_60.maybeFunc.ptr.field_1.value.pos = (size_t *)(local_98 + 8);
    *this = (Impl<1UL,_false>)0x0;
    local_88.tree._0_1_ = true;
    local_60.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(table + 1);
    local_60.maybeFunc.ptr.field_1.value.table = table;
    local_60.maybeFunc.ptr.field_1.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred(&local_60);
    in_RAX = extraout_RAX;
    aVar2 = extraout_RDX;
  }
LAB_00169027:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = in_RAX;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }